

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void __thiscall kj::HttpHeaders::takeOwnership(HttpHeaders *this,HttpHeaders *otherHeaders)

{
  RemoveConst<kj::Array<char>_> **ppRVar1;
  Array<char> *pAVar2;
  Array<char> *pAVar3;
  Array<char> *pAVar4;
  RemoveConst<kj::Array<char>_> *pRVar5;
  size_t newSize;
  Array<char> *str;
  Array<char> *pAVar6;
  
  pAVar6 = (otherHeaders->ownedStrings).builder.ptr;
  pAVar2 = (otherHeaders->ownedStrings).builder.pos;
  if (pAVar6 != pAVar2) {
    do {
      pAVar3 = (this->ownedStrings).builder.endPtr;
      if ((this->ownedStrings).builder.pos == pAVar3) {
        pAVar4 = (this->ownedStrings).builder.ptr;
        newSize = ((long)pAVar3 - (long)pAVar4 >> 3) * 0x5555555555555556;
        if (pAVar3 == pAVar4) {
          newSize = 4;
        }
        Vector<kj::Array<char>_>::setCapacity(&this->ownedStrings,newSize);
      }
      pRVar5 = (this->ownedStrings).builder.pos;
      pRVar5->ptr = pAVar6->ptr;
      pRVar5->size_ = pAVar6->size_;
      pRVar5->disposer = pAVar6->disposer;
      pAVar6->ptr = (char *)0x0;
      pAVar6->size_ = 0;
      ppRVar1 = &(this->ownedStrings).builder.pos;
      *ppRVar1 = *ppRVar1 + 1;
      pAVar6 = pAVar6 + 1;
    } while (pAVar6 != pAVar2);
  }
  ArrayBuilder<kj::Array<char>_>::clear(&(otherHeaders->ownedStrings).builder);
  return;
}

Assistant:

void HttpHeaders::takeOwnership(HttpHeaders&& otherHeaders) {
  for (auto& str: otherHeaders.ownedStrings) {
    ownedStrings.add(kj::mv(str));
  }
  otherHeaders.ownedStrings.clear();
}